

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

void aesgcm_set_iv(ptls_aead_context_t *_ctx,void *iv)

{
  uint uVar1;
  undefined1 auVar2 [16];
  
  uVar1 = (uint)iv & 0xfff;
  if ((uVar1 < 0xff1) || (0xff4 < uVar1)) {
    auVar2 = *iv;
  }
  else {
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])((ulong)iv & 0xfffffffffffffff0),
                         *(undefined1 (*) [16])("" + ((uint)iv & 0xf)));
  }
  auVar2 = vpshufb_avx(auVar2,_DAT_0012dd60);
  _ctx[1].do_get_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar2._0_8_;
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar2._8_8_;
  return;
}

Assistant:

NO_SANITIZE_ADDRESS
static inline __m128i loadn128(const void *p, size_t l)
{
    __m128i v, mask = _mm_loadu_si128((__m128i *)(loadn_mask + 32 - l));
    uintptr_t mod4k = (uintptr_t)p % 4096;

    if (PTLS_LIKELY(mod4k <= 4096 - 16) || mod4k + l > 4096) {
        v = _mm_loadu_si128(p);
    } else {
        v = loadn_end_of_page(p, l);
    }
    v = _mm_and_si128(v, mask);

    return v;
}